

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

BOOL need_rimuldar(dw_map *map)

{
  uint8_t uVar1;
  uint8_t uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  dw_warp *pdVar13;
  BOOL BVar14;
  char local_1e;
  byte bStack_1d;
  dw_warp warp;
  uint8_t garinham_lm;
  uint8_t tantegel_lm;
  uint8_t lm;
  dw_map *map_local;
  
  uVar7 = map->warps_from[4].x;
  uVar1 = map->walkable[(byte)uVar7][map->warps_from[4].y];
  uVar8 = map->warps_from->x;
  uVar2 = map->walkable[(byte)uVar8][map->warps_from->y];
  BVar14 = swamp_cave_in(map,'\x04');
  if ((BVar14 == FALSE) && ((uVar2 != uVar1 || (BVar14 = swamp_cave_in(map,'\0'), BVar14 == FALSE)))
     ) {
    map_local._4_4_ = FALSE;
  }
  else {
    pdVar13 = map->warps_from;
    uVar3 = pdVar13[0x11].map;
    uVar9 = pdVar13[0x11].x;
    if ((uVar3 == '\x01') &&
       ((map->walkable[(byte)uVar9][pdVar13[0x11].y] == uVar1 && ((map->key_access & 0x10) != 0))))
    {
      map_local._4_4_ = FALSE;
    }
    else {
      pdVar13 = map->warps_from;
      uVar4 = pdVar13[0xd].map;
      uVar10 = pdVar13[0xd].x;
      if (((uVar4 == '\x01') && (map->walkable[(byte)uVar10][pdVar13[0xd].y] == uVar1)) &&
         ((map->key_access & 1) != 0)) {
        map_local._4_4_ = FALSE;
      }
      else {
        pdVar13 = map->warps_from;
        uVar5 = pdVar13[8].map;
        uVar11 = pdVar13[8].x;
        if (((uVar5 == '\x01') && (map->walkable[(byte)uVar11][pdVar13[8].y] == uVar1)) &&
           ((map->key_access & 2) != 0)) {
          map_local._4_4_ = FALSE;
        }
        else {
          pdVar13 = map->warps_from;
          uVar6 = pdVar13[0x13].map;
          uVar12 = pdVar13[0x13].x;
          if (((uVar6 == '\x01') && (map->walkable[(byte)uVar12][pdVar13[0x13].y] == uVar1)) &&
             ((map->key_access & 4) != 0)) {
            map_local._4_4_ = FALSE;
          }
          else {
            map_local._4_4_ = TRUE;
          }
        }
      }
    }
  }
  return map_local._4_4_;
}

Assistant:

static BOOL need_rimuldar(dw_map *map)
{
    uint8_t lm, tantegel_lm, garinham_lm;
    dw_warp warp;

    warp = map->warps_from[WARP_TANTEGEL];
    tantegel_lm = map->walkable[warp.x][warp.y];
    warp = map->warps_from[WARP_GARINHAM];
    garinham_lm = map->walkable[warp.x][warp.y];

    /* Is swap cave in tantegel? */
    if (!swamp_cave_in(map, WARP_TANTEGEL)) {
        /* Is Garinhamp on the same mass? If so, does it have swamp cave? */
        if (garinham_lm != tantegel_lm || !swamp_cave_in(map, WARP_GARINHAM)) {
            return FALSE;
        }
    }

    warp = map->warps_from[WARP_TANTEGEL_BASEMENT];
    if (warp.map == 1) {
        lm = map->walkable[warp.x][warp.y];
        if (lm == tantegel_lm && map->key_access & KEY_IN_BASEMENT) {
            return FALSE;
        }
    }

    warp = map->warps_from[WARP_ERDRICKS_CAVE];
    if (warp.map == 1) {
        lm = map->walkable[warp.x][warp.y];
        if (lm == tantegel_lm && map->key_access & KEY_IN_TABLET) {
            return FALSE;
        }
    }

    warp = map->warps_from[WARP_MOUNTAIN_CAVE];
    if (warp.map == 1) {
        lm = map->walkable[warp.x][warp.y];
        if (lm == tantegel_lm && map->key_access & KEY_IN_MOUNTAIN) {
            return FALSE;
        }
    }

    warp = map->warps_from[WARP_GARINS_GRAVE];
    if (warp.map == 1) {
        lm = map->walkable[warp.x][warp.y];
        if (lm == tantegel_lm && map->key_access & KEY_IN_GRAVE) {
            return FALSE;
        }
    }

    return TRUE;
}